

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O3

void __thiscall
ExprTest_HashStringLiteral_Test::~ExprTest_HashStringLiteral_Test
          (ExprTest_HashStringLiteral_Test *this)

{
  (this->super_ExprTest).super_Test._vptr_Test = (_func_int **)&PTR__ExprTest_001a4a58;
  mp::BasicExprFactory<std::allocator<char>_>::~BasicExprFactory(&(this->super_ExprTest).factory_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x58);
  return;
}

Assistant:

TEST_F(ExprTest, HashStringLiteral) {
  // String literal can only occur as a function argument, so test
  // it as a part of a call expression.
  Expr args[] = {factory_.MakeStringLiteral("test")};
  mp::Function f = factory_.AddFunction("foo", 1, mp::func::SYMBOLIC);
  size_t hash = HashCombine<int>(0, expr::CALL);
  hash = HashCombine(hash, f.name());
  TestString ts = {"test"};
  hash = HashCombine(hash, ts);
  EXPECT_EQ(hash, ExprHash()(MakeCall(f, args)));
}